

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O3

void __thiscall
Inject::ctor_inject::ctor_inject(ctor_inject *this,type *service1,type *service2,type *service3)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long local_140;
  unique_id local_138;
  unique_id *local_130;
  long *local_128;
  undefined **local_120;
  undefined1 local_118;
  undefined8 *local_110;
  char *local_108;
  undefined1 local_100 [8];
  undefined8 local_f8;
  shared_count sStack_f0;
  undefined **local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  unique_id **local_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined8 *local_b8;
  long **local_b0;
  type *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  this->ctor_num = 3;
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,599);
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_00163f68;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  if (service1->px != (element_type *)0x0) {
    iVar1 = (**service1->px->_vptr_service)();
    local_140 = CONCAT44(extraout_var,iVar1);
    local_a8 = service3;
    local_138 = inject::id_of<Inject::impl1>::id();
    local_100[0] = CONCAT44(extraout_var,iVar1) == local_138;
    local_130 = &local_138;
    local_f8 = 0;
    sStack_f0.pi_ = (sp_counted_base *)0x0;
    local_a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
    ;
    local_98 = "";
    local_128 = &local_140;
    local_b0 = &local_128;
    local_c0 = 0;
    local_c8 = &PTR__lazy_ostream_00163fb8;
    local_b8 = &boost::unit_test::lazy_ostream::inst;
    local_d0 = &local_130;
    local_e0 = 0;
    local_e8 = &PTR__lazy_ostream_00163fb8;
    local_d8 = &boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion
              (local_100,&local_120,&local_a0,599,1,2,2,"service1->id()",&local_c8,
               "id_of<impl1>::id()",&local_e8);
    boost::detail::shared_count::~shared_count(&sStack_f0);
    local_60 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
    ;
    local_58 = "";
    local_70 = &boost::unit_test::basic_cstring<char_const>::null;
    local_68 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,600);
    local_118 = 0;
    local_120 = &PTR__lazy_ostream_00163f68;
    local_110 = &boost::unit_test::lazy_ostream::inst;
    local_108 = "";
    if (service2->px != (element_type *)0x0) {
      iVar1 = (**service2->px->_vptr_service)();
      local_140 = CONCAT44(extraout_var_00,iVar1);
      local_138 = inject::id_of<Inject::impl1>::id();
      local_100[0] = CONCAT44(extraout_var_00,iVar1) == local_138;
      local_f8 = 0;
      sStack_f0.pi_ = (sp_counted_base *)0x0;
      local_a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
      ;
      local_98 = "";
      local_128 = &local_140;
      local_c0 = 0;
      local_c8 = &PTR__lazy_ostream_00163fb8;
      local_b8 = &boost::unit_test::lazy_ostream::inst;
      local_b0 = &local_128;
      local_130 = &local_138;
      local_e0 = 0;
      local_e8 = &PTR__lazy_ostream_00163fb8;
      local_d8 = &boost::unit_test::lazy_ostream::inst;
      local_d0 = &local_130;
      boost::test_tools::tt_detail::report_assertion
                (local_100,&local_120,&local_a0,600,1,2,2,"service2->id()",&local_c8,
                 "id_of<impl1>::id()",&local_e8);
      boost::detail::shared_count::~shared_count(&sStack_f0);
      local_80 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
      ;
      local_78 = "";
      local_90 = &boost::unit_test::basic_cstring<char_const>::null;
      local_88 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x259);
      local_118 = 0;
      local_120 = &PTR__lazy_ostream_00163f68;
      local_110 = &boost::unit_test::lazy_ostream::inst;
      local_108 = "";
      if (local_a8->px != (element_type *)0x0) {
        iVar1 = (**local_a8->px->_vptr_service)();
        local_140 = CONCAT44(extraout_var_01,iVar1);
        local_138 = inject::id_of<Inject::impl1>::id();
        local_100[0] = CONCAT44(extraout_var_01,iVar1) == local_138;
        local_f8 = 0;
        sStack_f0.pi_ = (sp_counted_base *)0x0;
        local_a0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
        ;
        local_98 = "";
        local_128 = &local_140;
        local_c0 = 0;
        local_c8 = &PTR__lazy_ostream_00163fb8;
        local_b8 = &boost::unit_test::lazy_ostream::inst;
        local_b0 = &local_128;
        local_130 = &local_138;
        local_e0 = 0;
        local_e8 = &PTR__lazy_ostream_00163fb8;
        local_d8 = &boost::unit_test::lazy_ostream::inst;
        local_d0 = &local_130;
        boost::test_tools::tt_detail::report_assertion
                  (local_100,&local_120,&local_a0,0x259,1,2,2,"service3->id()",&local_c8,
                   "id_of<impl1>::id()",&local_e8);
        boost::detail::shared_count::~shared_count(&sStack_f0);
        return;
      }
    }
  }
  local_108 = "";
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_00163f68;
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Inject::service>::operator->() const [T = Inject::service]"
               );
}

Assistant:

ctor_inject(
            context<>::ptr<service>::type service1,
            context<>::ptr<service>::type service2,
            context<>::ptr<service>::type service3) {
        ctor_num = 3;
        BOOST_CHECK_EQUAL(service1->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service2->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service3->id(), id_of<impl1>::id());
    }